

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O0

void __thiscall Fl_GTK_File_Chooser::Fl_GTK_File_Chooser(Fl_GTK_File_Chooser *this,int val)

{
  int val_local;
  Fl_GTK_File_Chooser *this_local;
  
  Fl_FLTK_File_Chooser::Fl_FLTK_File_Chooser(&this->super_Fl_FLTK_File_Chooser,-1);
  (this->super_Fl_FLTK_File_Chooser)._vptr_Fl_FLTK_File_Chooser =
       (_func_int **)&PTR__Fl_GTK_File_Chooser_002ecd40;
  this->gtkw_ptr = (GtkWidget *)0x0;
  this->gtkw_slist = (void *)0x0;
  this->gtkw_count = 0;
  this->gtkw_filename = (char *)0x0;
  this->gtkw_title = (char *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._btype = val;
  this->previous_filter = (char *)0x0;
  return;
}

Assistant:

Fl_GTK_File_Chooser::Fl_GTK_File_Chooser(int val) : Fl_FLTK_File_Chooser(-1)
{
  gtkw_ptr   = NULL;    // used to hold a GtkWidget* 
  gtkw_slist = NULL;    // will hold the returned file names in a multi-selection...
  gtkw_count = 0;       // How many items were selected?
  gtkw_filename = NULL; // holds the last name we read back in a single file selection...
  gtkw_title = NULL;    // dialog title
  _btype = val;
  previous_filter = NULL;
}